

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O0

type jsoncons::binary::
     native_to_big<int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
               (int val,back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        d_first)

{
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  this;
  int in_EDI;
  uint8_t item;
  uint8_t *__end0;
  uint8_t *__begin0;
  uint8_t (*__range2) [4];
  uint8_t buf [4];
  int val2;
  value_type *in_stack_ffffffffffffffb8;
  type_conflict *local_28;
  type_conflict local_14;
  type_conflict local_10 [2];
  back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_8;
  
  local_14 = byte_swap<int>(in_EDI);
  local_10[0] = local_14;
  for (local_28 = &local_14; local_28 != local_10; local_28 = (type_conflict *)((long)local_28 + 1))
  {
    this = std::
           back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
           ::operator++(&local_8,0);
    std::
    back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::operator*((back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)&stack0xffffffffffffffc0);
    std::
    back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::operator=((back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)this.container,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_big(T val, OutputIt d_first)
    {
        T val2 = byte_swap(val);
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val2, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }